

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt32x4_3Int4
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *this_00;
  RegOpnd *pRVar3;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *src1_01;
  RegOpnd *src1_02;
  RegOpnd *src1_03;
  Instr *pIVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  OpCode opcode;
  Instr *instr;
  RegOpnd *src6Opnd;
  RegOpnd *src5Opnd;
  RegOpnd *src4Opnd;
  RegOpnd *src3Opnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128I4);
  pRVar3 = BuildSrcOpnd(this,src1RegSlot,TySimd128I4);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128I4);
  src1_00 = BuildIntConstOpnd(this,src3RegSlot);
  src1_01 = BuildIntConstOpnd(this,src4RegSlot);
  src1_02 = BuildIntConstOpnd(this,src5RegSlot);
  src1_03 = BuildIntConstOpnd(this,src6RegSlot);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&pRVar3->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&src1->super_Opnd,ValueType::Simd);
  pIVar4 = AddExtendedArg(this,pRVar3,(RegOpnd *)0x0,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1,pRVar3,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1_00,pRVar3,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1_01,pRVar3,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1_02,pRVar3,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1_03,pRVar3,offset);
  if (newOpcode != Simd128_Shuffle_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1067,"(newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_I4)",
                       "newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_I4");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pIVar4 = IR::Instr::New(Simd128_Shuffle_I4,&this_00->super_Opnd,pOVar5,this->m_func);
  AddInstr(this,pIVar4,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildInt32x4_3Int4(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG7)
{
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128I4);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128I4);

    IR::RegOpnd * src3Opnd = BuildIntConstOpnd(src3RegSlot);
    IR::RegOpnd * src4Opnd = BuildIntConstOpnd(src4RegSlot);
    IR::RegOpnd * src5Opnd = BuildIntConstOpnd(src5RegSlot);
    IR::RegOpnd * src6Opnd = BuildIntConstOpnd(src6RegSlot);

    IR::Instr * instr = nullptr;
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src4Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src5Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src6Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Assert(newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_I4);
    Js::OpCode opcode = Js::OpCode::Simd128_Shuffle_I4;

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}